

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O0

fourcc_t StringToFourCC(tchar_t *In,bool_t Upper)

{
  ulong local_30;
  size_t i;
  bool_t bStack_20;
  tchar_t s [5];
  bool_t Upper_local;
  tchar_t *In_local;
  
  if (*In == '\0') {
    In_local._4_4_ = 0;
  }
  else {
    bStack_20 = Upper;
    tcscpy_s((tchar_t *)((long)&i + 3),5,In);
    if (bStack_20 != 0) {
      tcsupr((tchar_t *)((long)&i + 3));
    }
    for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
      if (*(char *)((long)&i + local_30 + 3) == '\0') {
        for (; local_30 < 4; local_30 = local_30 + 1) {
          *(undefined1 *)((long)&i + local_30 + 3) = 0x5f;
        }
      }
    }
    In_local._4_4_ = i._3_4_;
  }
  return In_local._4_4_;
}

Assistant:

fourcc_t StringToFourCC(const tchar_t* In, bool_t Upper)
{
    tchar_t s[4+1];
    size_t i;

    if (!In[0])
        return 0;

    tcscpy_s(s,TSIZEOF(s),In);

    if (Upper)
        tcsupr(s);

    for (i=1;i<4;++i)
        if (!s[i])
            for (;i<4;++i)
                s[i] = '_';

    return FOURCC((uint8_t)s[0],(uint8_t)s[1],(uint8_t)s[2],(uint8_t)s[3]);
}